

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::anon_unknown_21::ValidateValuesFeatureSupport
          (anon_unknown_21 *this,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  EnumDescriptor *pEVar3;
  LogMessage *pLVar4;
  FieldOptions *this_00;
  FieldOptions_FeatureSupport *parent_00;
  EnumValueDescriptor *value_00;
  string_view field_name;
  EnumValueDescriptor *value;
  int i;
  FeatureSupport *parent;
  LogMessage local_30;
  Voidify local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  Status *_status;
  
  local_18 = field;
  field_local = (FieldDescriptor *)this;
  pEVar3 = FieldDescriptor::enum_type(field);
  if (pEVar3 == (EnumDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
               ,0x9f,"field.enum_type() != nullptr");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  this_00 = FieldDescriptor::options(local_18);
  parent_00 = FieldOptions::feature_support(this_00);
  value._4_4_ = 0;
  while( true ) {
    pEVar3 = FieldDescriptor::enum_type(local_18);
    iVar2 = EnumDescriptor::value_count(pEVar3);
    if (iVar2 <= value._4_4_) {
      absl::lts_20250127::OkStatus();
      return (Status)(uintptr_t)this;
    }
    pEVar3 = FieldDescriptor::enum_type(local_18);
    value_00 = EnumDescriptor::value(pEVar3,value._4_4_);
    field_name = FieldDescriptor::full_name(local_18);
    ValidateValueFeatureSupport(this,parent_00,value_00,field_name);
    bVar1 = absl::lts_20250127::Status::ok((Status *)this);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    absl::lts_20250127::Status::~Status((Status *)this);
    value._4_4_ = value._4_4_ + 1;
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateValuesFeatureSupport(const FieldDescriptor& field) {
  // This only applies to enum features.
  ABSL_CHECK(field.enum_type() != nullptr);

  const FieldOptions::FeatureSupport& parent =
      field.options().feature_support();

  for (int i = 0; i < field.enum_type()->value_count(); ++i) {
    const EnumValueDescriptor& value = *field.enum_type()->value(i);
    RETURN_IF_ERROR(
        ValidateValueFeatureSupport(parent, value, field.full_name()));
  }

  return absl::OkStatus();
}